

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void icetDestroyContext(IceTContext context)

{
  IceTContext local_18;
  IceTContext saved_current_context;
  IceTContext context_local;
  
  local_18 = icetGetContext();
  if (context == local_18) {
    local_18 = (IceTContext)0x0;
  }
  icetSetContext(context);
  callDestructor(0x61);
  context->magic_number = 0;
  icetStateDestroy(context->state);
  context->state = (IceTState)0x0;
  (*context->communicator->Destroy)(context->communicator);
  icetSetContext(local_18);
  free(context);
  return;
}

Assistant:

void icetDestroyContext(IceTContext context)
{
    IceTContext saved_current_context;

    saved_current_context = icetGetContext();
    if (context == saved_current_context) {
        icetRaiseDebug("Destroying current context.");
        saved_current_context = NULL;
    }

  /* Temporarily make the context to be destroyed current. */
    icetSetContext(context);

  /* Call destructors for other dependent units. */
    callDestructor(ICET_RENDER_LAYER_DESTRUCTOR);

  /* From here on out be careful.  We are invalidating the context. */
    context->magic_number = 0;

    icetStateDestroy(context->state);
    context->state = NULL;

    context->communicator->Destroy(context->communicator);

  /* The context is now completely destroyed and now null.  Restore saved
     context. */
    icetSetContext(saved_current_context);

    free(context);
}